

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  Ref<embree::Geometry> *pRVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  ulong uVar35;
  ulong unaff_R12;
  size_t mask;
  ulong uVar36;
  ulong uVar37;
  undefined4 uVar38;
  Geometry *pGVar39;
  long lVar40;
  float fVar41;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  vint4 bi;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar57;
  uint uVar58;
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar59;
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar79 [16];
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar88 [16];
  vint4 bi_1;
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1088 [16];
  float local_1078 [4];
  float local_1068 [4];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  float local_1038 [4];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  pauVar33 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_fb8._4_4_ = uVar2;
  local_fb8._0_4_ = uVar2;
  local_fb8._8_4_ = uVar2;
  local_fb8._12_4_ = uVar2;
  auVar70 = ZEXT1664(local_fb8);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fc8._4_4_ = uVar2;
  local_fc8._0_4_ = uVar2;
  local_fc8._8_4_ = uVar2;
  local_fc8._12_4_ = uVar2;
  auVar73 = ZEXT1664(local_fc8);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fd8._4_4_ = uVar2;
  local_fd8._0_4_ = uVar2;
  local_fd8._8_4_ = uVar2;
  local_fd8._12_4_ = uVar2;
  auVar75 = ZEXT1664(local_fd8);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1008 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar28 = (tray->tfar).field_0.i[k];
  auVar95 = ZEXT1664(CONCAT412(iVar28,CONCAT48(iVar28,CONCAT44(iVar28,iVar28))));
  iVar28 = (tray->tnear).field_0.i[k];
  local_1018._4_4_ = iVar28;
  local_1018._0_4_ = iVar28;
  local_1018._8_4_ = iVar28;
  local_1018._12_4_ = iVar28;
  auVar96 = ZEXT1664(local_1018);
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fVar41 = local_fe8;
  fVar45 = local_fe8;
  fVar46 = local_fe8;
  fVar47 = local_fe8;
  fVar97 = local_ff8;
  fVar80 = local_ff8;
  fVar82 = local_ff8;
  fVar84 = local_ff8;
  fVar86 = local_1008;
  fVar89 = local_1008;
  fVar91 = local_1008;
  fVar93 = local_1008;
  do {
    do {
      do {
        if (pauVar33 == (undefined1 (*) [16])&local_f78) {
          return;
        }
        pauVar32 = pauVar33 + -1;
        pauVar33 = pauVar33 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar32 + 8));
      uVar37 = *(ulong *)*pauVar33;
      pauVar32 = pauVar33;
      do {
        if ((uVar37 & 8) == 0) {
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar29),auVar70._0_16_);
          auVar42._0_4_ = fVar41 * auVar43._0_4_;
          auVar42._4_4_ = fVar45 * auVar43._4_4_;
          auVar42._8_4_ = fVar46 * auVar43._8_4_;
          auVar42._12_4_ = fVar47 * auVar43._12_4_;
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar34),auVar73._0_16_);
          auVar48._0_4_ = fVar97 * auVar43._0_4_;
          auVar48._4_4_ = fVar80 * auVar43._4_4_;
          auVar48._8_4_ = fVar82 * auVar43._8_4_;
          auVar48._12_4_ = fVar84 * auVar43._12_4_;
          auVar43 = vpmaxsd_avx(auVar42,auVar48);
          auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar35),auVar75._0_16_);
          auVar49._0_4_ = fVar86 * auVar42._0_4_;
          auVar49._4_4_ = fVar89 * auVar42._4_4_;
          auVar49._8_4_ = fVar91 * auVar42._8_4_;
          auVar49._12_4_ = fVar93 * auVar42._12_4_;
          auVar42 = vpmaxsd_avx(auVar49,auVar96._0_16_);
          local_10d8 = vpmaxsd_avx(auVar43,auVar42);
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar29 ^ 0x10)),
                               auVar70._0_16_);
          auVar50._0_4_ = fVar41 * auVar43._0_4_;
          auVar50._4_4_ = fVar45 * auVar43._4_4_;
          auVar50._8_4_ = fVar46 * auVar43._8_4_;
          auVar50._12_4_ = fVar47 * auVar43._12_4_;
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar34 ^ 0x10)),
                               auVar73._0_16_);
          auVar53._0_4_ = fVar97 * auVar43._0_4_;
          auVar53._4_4_ = fVar80 * auVar43._4_4_;
          auVar53._8_4_ = fVar82 * auVar43._8_4_;
          auVar53._12_4_ = fVar84 * auVar43._12_4_;
          auVar43 = vpminsd_avx(auVar50,auVar53);
          auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar35 ^ 0x10)),
                               auVar75._0_16_);
          auVar54._0_4_ = fVar86 * auVar42._0_4_;
          auVar54._4_4_ = fVar89 * auVar42._4_4_;
          auVar54._8_4_ = fVar91 * auVar42._8_4_;
          auVar54._12_4_ = fVar93 * auVar42._12_4_;
          auVar42 = vpminsd_avx(auVar54,auVar95._0_16_);
          auVar43 = vpminsd_avx(auVar43,auVar42);
          auVar43 = vpcmpgtd_avx(local_10d8,auVar43);
          uVar27 = vmovmskps_avx(auVar43);
          unaff_R12 = ((ulong)uVar27 ^ 0xf) & 0xff;
        }
        pauVar33 = pauVar32;
        if ((uVar37 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar28 = 4;
          }
          else {
            uVar36 = uVar37 & 0xfffffffffffffff0;
            lVar31 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            iVar28 = 0;
            uVar37 = *(ulong *)(uVar36 + lVar31 * 8);
            uVar30 = unaff_R12 - 1 & unaff_R12;
            if (uVar30 != 0) {
              uVar27 = *(uint *)(local_10d8 + lVar31 * 4);
              lVar31 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              uVar5 = *(ulong *)(uVar36 + lVar31 * 8);
              uVar57 = *(uint *)(local_10d8 + lVar31 * 4);
              uVar30 = uVar30 - 1 & uVar30;
              if (uVar30 == 0) {
                pauVar33 = pauVar32 + 1;
                if (uVar27 < uVar57) {
                  *(ulong *)*pauVar32 = uVar5;
                  *(uint *)(*pauVar32 + 8) = uVar57;
                }
                else {
                  *(ulong *)*pauVar32 = uVar37;
                  *(uint *)(*pauVar32 + 8) = uVar27;
                  uVar37 = uVar5;
                }
              }
              else {
                auVar43._8_8_ = 0;
                auVar43._0_8_ = uVar37;
                auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar27));
                auVar51._8_8_ = 0;
                auVar51._0_8_ = uVar5;
                auVar42 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar57));
                lVar31 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                auVar55._8_8_ = 0;
                auVar55._0_8_ = *(ulong *)(uVar36 + lVar31 * 8);
                auVar49 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_10d8 + lVar31 * 4)));
                auVar48 = vpcmpgtd_avx(auVar42,auVar43);
                uVar30 = uVar30 - 1 & uVar30;
                iVar28 = 0;
                if (uVar30 == 0) {
                  auVar50 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar42,auVar43,auVar50);
                  auVar43 = vblendvps_avx(auVar43,auVar42,auVar50);
                  auVar42 = vpcmpgtd_avx(auVar49,auVar48);
                  auVar50 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar49,auVar48,auVar50);
                  auVar48 = vblendvps_avx(auVar48,auVar49,auVar50);
                  auVar49 = vpcmpgtd_avx(auVar48,auVar43);
                  auVar50 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar48,auVar43,auVar50);
                  auVar43 = vblendvps_avx(auVar43,auVar48,auVar50);
                  *pauVar32 = auVar43;
                  pauVar32[1] = auVar49;
                  uVar37 = auVar42._0_8_;
                  pauVar33 = pauVar32 + 2;
                }
                else {
                  lVar31 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                    }
                  }
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = *(ulong *)(uVar36 + lVar31 * 8);
                  auVar53 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_10d8 + lVar31 * 4)));
                  auVar50 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar42,auVar43,auVar50);
                  auVar43 = vblendvps_avx(auVar43,auVar42,auVar50);
                  auVar42 = vpcmpgtd_avx(auVar53,auVar49);
                  auVar50 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar53,auVar49,auVar50);
                  auVar49 = vblendvps_avx(auVar49,auVar53,auVar50);
                  auVar50 = vpcmpgtd_avx(auVar49,auVar43);
                  auVar53 = vpshufd_avx(auVar50,0xaa);
                  auVar50 = vblendvps_avx(auVar49,auVar43,auVar53);
                  auVar43 = vblendvps_avx(auVar43,auVar49,auVar53);
                  auVar49 = vpcmpgtd_avx(auVar42,auVar48);
                  auVar53 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar42,auVar48,auVar53);
                  auVar42 = vblendvps_avx(auVar48,auVar42,auVar53);
                  auVar48 = vpcmpgtd_avx(auVar50,auVar42);
                  auVar53 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar50,auVar42,auVar53);
                  auVar42 = vblendvps_avx(auVar42,auVar50,auVar53);
                  *pauVar32 = auVar43;
                  pauVar32[1] = auVar42;
                  pauVar32[2] = auVar48;
                  uVar37 = auVar49._0_8_;
                  pauVar33 = pauVar32 + 3;
                }
              }
            }
          }
        }
        else {
          iVar28 = 6;
        }
        pauVar32 = pauVar33;
      } while (iVar28 == 0);
    } while (iVar28 != 6);
    uVar36 = (ulong)((uint)uVar37 & 0xf);
    if (uVar36 != 8) {
      uVar37 = uVar37 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4);
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
      local_f88 = *(float *)(ray + k * 4 + 0x40);
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      local_f98 = *(float *)(ray + k * 4 + 0x50);
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      local_fa8 = *(float *)(ray + k * 4 + 0x60);
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      lVar31 = 0;
      do {
        lVar40 = lVar31 * 0xb0;
        pfVar1 = (float *)(uVar37 + 0x80 + lVar40);
        fVar86 = *pfVar1;
        fVar89 = pfVar1[1];
        fVar91 = pfVar1[2];
        fVar93 = pfVar1[3];
        pfVar1 = (float *)(uVar37 + 0x40 + lVar40);
        fVar8 = *pfVar1;
        fVar9 = pfVar1[1];
        fVar10 = pfVar1[2];
        fVar11 = pfVar1[3];
        auVar60._0_4_ = fVar8 * fVar86;
        auVar60._4_4_ = fVar9 * fVar89;
        auVar60._8_4_ = fVar10 * fVar91;
        auVar60._12_4_ = fVar11 * fVar93;
        pfVar1 = (float *)(uVar37 + 0x70 + lVar40);
        fVar12 = *pfVar1;
        fVar13 = pfVar1[1];
        fVar14 = pfVar1[2];
        fVar15 = pfVar1[3];
        auVar43 = *(undefined1 (*) [16])(uVar37 + 0x50 + lVar40);
        fVar41 = auVar43._0_4_;
        auVar62._0_4_ = fVar12 * fVar41;
        fVar46 = auVar43._4_4_;
        auVar62._4_4_ = fVar13 * fVar46;
        fVar97 = auVar43._8_4_;
        auVar62._8_4_ = fVar14 * fVar97;
        fVar82 = auVar43._12_4_;
        auVar62._12_4_ = fVar15 * fVar82;
        local_1048 = vsubps_avx(auVar62,auVar60);
        pfVar1 = (float *)(uVar37 + 0x60 + lVar40);
        fVar16 = *pfVar1;
        fVar17 = pfVar1[1];
        fVar18 = pfVar1[2];
        fVar19 = pfVar1[3];
        auVar74._0_4_ = fVar41 * fVar16;
        auVar74._4_4_ = fVar46 * fVar17;
        auVar74._8_4_ = fVar97 * fVar18;
        auVar74._12_4_ = fVar82 * fVar19;
        auVar24._4_4_ = uVar2;
        auVar24._0_4_ = uVar2;
        auVar24._8_4_ = uVar2;
        auVar24._12_4_ = uVar2;
        auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + lVar40),auVar24);
        auVar26._4_4_ = uVar3;
        auVar26._0_4_ = uVar3;
        auVar26._8_4_ = uVar3;
        auVar26._12_4_ = uVar3;
        auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x10 + lVar40),auVar26);
        auVar25._4_4_ = uVar4;
        auVar25._0_4_ = uVar4;
        auVar25._8_4_ = uVar4;
        auVar25._12_4_ = uVar4;
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + lVar40),auVar25);
        pfVar1 = (float *)(uVar37 + 0x30 + lVar40);
        fVar20 = *pfVar1;
        fVar21 = pfVar1[1];
        fVar22 = pfVar1[2];
        fVar23 = pfVar1[3];
        auVar76._0_4_ = fVar86 * fVar20;
        auVar76._4_4_ = fVar89 * fVar21;
        auVar76._8_4_ = fVar91 * fVar22;
        auVar76._12_4_ = fVar93 * fVar23;
        auVar49 = vsubps_avx(auVar76,auVar74);
        auVar77._0_4_ = fVar12 * fVar20;
        auVar77._4_4_ = fVar13 * fVar21;
        auVar77._8_4_ = fVar14 * fVar22;
        auVar77._12_4_ = fVar15 * fVar23;
        auVar67._0_4_ = fVar8 * fVar16;
        auVar67._4_4_ = fVar9 * fVar17;
        auVar67._8_4_ = fVar10 * fVar18;
        auVar67._12_4_ = fVar11 * fVar19;
        auVar50 = vsubps_avx(auVar67,auVar77);
        fVar78 = auVar48._0_4_;
        auVar68._0_4_ = fVar78 * local_f98;
        fVar81 = auVar48._4_4_;
        auVar68._4_4_ = fVar81 * fStack_f94;
        fVar83 = auVar48._8_4_;
        auVar68._8_4_ = fVar83 * fStack_f90;
        fVar85 = auVar48._12_4_;
        auVar68._12_4_ = fVar85 * fStack_f8c;
        fVar45 = auVar42._0_4_;
        auVar98._0_4_ = local_fa8 * fVar45;
        fVar47 = auVar42._4_4_;
        auVar98._4_4_ = fStack_fa4 * fVar47;
        fVar80 = auVar42._8_4_;
        auVar98._8_4_ = fStack_fa0 * fVar80;
        fVar84 = auVar42._12_4_;
        auVar98._12_4_ = fStack_f9c * fVar84;
        auVar42 = vsubps_avx(auVar98,auVar68);
        fVar87 = auVar43._0_4_;
        auVar99._0_4_ = fVar87 * local_fa8;
        fVar90 = auVar43._4_4_;
        auVar99._4_4_ = fVar90 * fStack_fa4;
        fVar92 = auVar43._8_4_;
        auVar99._8_4_ = fVar92 * fStack_fa0;
        fVar94 = auVar43._12_4_;
        auVar99._12_4_ = fVar94 * fStack_f9c;
        auVar79._0_4_ = local_f88 * fVar78;
        auVar79._4_4_ = fStack_f84 * fVar81;
        auVar79._8_4_ = fStack_f80 * fVar83;
        auVar79._12_4_ = fStack_f7c * fVar85;
        auVar48 = vsubps_avx(auVar79,auVar99);
        auVar100._0_4_ = local_f88 * fVar45;
        auVar100._4_4_ = fStack_f84 * fVar47;
        auVar100._8_4_ = fStack_f80 * fVar80;
        auVar100._12_4_ = fStack_f7c * fVar84;
        auVar88._0_4_ = fVar87 * local_f98;
        auVar88._4_4_ = fVar90 * fStack_f94;
        auVar88._8_4_ = fVar92 * fStack_f90;
        auVar88._12_4_ = fVar94 * fStack_f8c;
        auVar53 = vsubps_avx(auVar88,auVar100);
        local_1178._0_4_ = auVar49._0_4_;
        local_1178._4_4_ = auVar49._4_4_;
        uStack_1170._0_4_ = auVar49._8_4_;
        uStack_1170._4_4_ = auVar49._12_4_;
        auVar71._0_4_ =
             local_1048._0_4_ * local_f88 +
             auVar50._0_4_ * local_fa8 + (float)local_1178 * local_f98;
        auVar71._4_4_ =
             local_1048._4_4_ * fStack_f84 +
             auVar50._4_4_ * fStack_fa4 + local_1178._4_4_ * fStack_f94;
        auVar71._8_4_ =
             local_1048._8_4_ * fStack_f80 +
             auVar50._8_4_ * fStack_fa0 + (float)uStack_1170 * fStack_f90;
        auVar71._12_4_ =
             local_1048._12_4_ * fStack_f7c +
             auVar50._12_4_ * fStack_f9c + uStack_1170._4_4_ * fStack_f8c;
        auVar44._8_4_ = 0x80000000;
        auVar44._0_8_ = 0x8000000080000000;
        auVar44._12_4_ = 0x80000000;
        auVar43 = vandps_avx(auVar71,auVar44);
        uVar27 = auVar43._0_4_;
        local_10d8._0_4_ =
             (float)(uVar27 ^ (uint)(fVar16 * auVar42._0_4_ +
                                    auVar53._0_4_ * fVar86 + auVar48._0_4_ * fVar12));
        uVar57 = auVar43._4_4_;
        local_10d8._4_4_ =
             (float)(uVar57 ^ (uint)(fVar17 * auVar42._4_4_ +
                                    auVar53._4_4_ * fVar89 + auVar48._4_4_ * fVar13));
        uVar58 = auVar43._8_4_;
        local_10d8._8_4_ =
             (float)(uVar58 ^ (uint)(fVar18 * auVar42._8_4_ +
                                    auVar53._8_4_ * fVar91 + auVar48._8_4_ * fVar14));
        uVar59 = auVar43._12_4_;
        local_10d8._12_4_ =
             (float)(uVar59 ^ (uint)(fVar19 * auVar42._12_4_ +
                                    auVar53._12_4_ * fVar93 + auVar48._12_4_ * fVar15));
        local_10c8._0_4_ =
             (float)(uVar27 ^ (uint)(fVar20 * auVar42._0_4_ +
                                    auVar53._0_4_ * fVar41 + fVar8 * auVar48._0_4_));
        local_10c8._4_4_ =
             (float)(uVar57 ^ (uint)(fVar21 * auVar42._4_4_ +
                                    auVar53._4_4_ * fVar46 + fVar9 * auVar48._4_4_));
        local_10c8._8_4_ =
             (float)(uVar58 ^ (uint)(fVar22 * auVar42._8_4_ +
                                    auVar53._8_4_ * fVar97 + fVar10 * auVar48._8_4_));
        local_10c8._12_4_ =
             (float)(uVar59 ^ (uint)(fVar23 * auVar42._12_4_ +
                                    auVar53._12_4_ * fVar82 + fVar11 * auVar48._12_4_));
        auVar48 = ZEXT816(0) << 0x20;
        auVar43 = vcmpps_avx(local_10d8,auVar48,5);
        auVar42 = vcmpps_avx(local_10c8,auVar48,5);
        auVar43 = vandps_avx(auVar43,auVar42);
        auVar63._8_4_ = 0x7fffffff;
        auVar63._0_8_ = 0x7fffffff7fffffff;
        auVar63._12_4_ = 0x7fffffff;
        local_10a8 = vandps_avx(auVar71,auVar63);
        auVar42 = vcmpps_avx(auVar71,auVar48,4);
        auVar43 = vandps_avx(auVar43,auVar42);
        auVar64._0_4_ = local_10d8._0_4_ + local_10c8._0_4_;
        auVar64._4_4_ = local_10d8._4_4_ + local_10c8._4_4_;
        auVar64._8_4_ = local_10d8._8_4_ + local_10c8._8_4_;
        auVar64._12_4_ = local_10d8._12_4_ + local_10c8._12_4_;
        auVar42 = vcmpps_avx(auVar64,local_10a8,2);
        auVar48 = auVar42 & auVar43;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar48[0xf] < '\0') {
          auVar43 = vandps_avx(auVar43,auVar42);
          local_10b8._0_4_ =
               (float)(uVar27 ^ (uint)(local_1048._0_4_ * fVar87 +
                                      (float)local_1178 * fVar45 + fVar78 * auVar50._0_4_));
          local_10b8._4_4_ =
               (float)(uVar57 ^ (uint)(local_1048._4_4_ * fVar90 +
                                      local_1178._4_4_ * fVar47 + fVar81 * auVar50._4_4_));
          local_10b8._8_4_ =
               (float)(uVar58 ^ (uint)(local_1048._8_4_ * fVar92 +
                                      (float)uStack_1170 * fVar80 + fVar83 * auVar50._8_4_));
          local_10b8._12_4_ =
               (float)(uVar59 ^ (uint)(local_1048._12_4_ * fVar94 +
                                      uStack_1170._4_4_ * fVar84 + fVar85 * auVar50._12_4_));
          fVar41 = *(float *)(ray + k * 4 + 0x30);
          fVar45 = local_10a8._0_4_;
          auVar65._0_4_ = fVar45 * fVar41;
          fVar46 = local_10a8._4_4_;
          auVar65._4_4_ = fVar46 * fVar41;
          fVar47 = local_10a8._8_4_;
          auVar65._8_4_ = fVar47 * fVar41;
          fVar97 = local_10a8._12_4_;
          auVar65._12_4_ = fVar97 * fVar41;
          auVar42 = vcmpps_avx(auVar65,local_10b8,1);
          fVar41 = *(float *)(ray + k * 4 + 0x80);
          auVar69._0_4_ = fVar45 * fVar41;
          auVar69._4_4_ = fVar46 * fVar41;
          auVar69._8_4_ = fVar47 * fVar41;
          auVar69._12_4_ = fVar97 * fVar41;
          auVar48 = vcmpps_avx(local_10b8,auVar69,2);
          auVar42 = vandps_avx(auVar42,auVar48);
          auVar48 = auVar43 & auVar42;
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar48[0xf] < '\0') {
            local_10e8 = vandps_avx(auVar42,auVar43);
            local_1088 = local_10e8;
            local_1038[0] = (float)local_1178;
            local_1038[1] = local_1178._4_4_;
            local_1038[2] = (float)uStack_1170;
            local_1038[3] = uStack_1170._4_4_;
            local_1158 = auVar50._0_8_;
            uStack_1150 = auVar50._8_8_;
            local_1028 = local_1158;
            uStack_1020 = uStack_1150;
            auVar43 = vrcpps_avx(local_10a8);
            fVar41 = auVar43._0_4_;
            auVar52._0_4_ = fVar45 * fVar41;
            fVar45 = auVar43._4_4_;
            auVar52._4_4_ = fVar46 * fVar45;
            fVar46 = auVar43._8_4_;
            auVar52._8_4_ = fVar47 * fVar46;
            fVar47 = auVar43._12_4_;
            auVar52._12_4_ = fVar97 * fVar47;
            auVar56._8_4_ = 0x3f800000;
            auVar56._0_8_ = &DAT_3f8000003f800000;
            auVar56._12_4_ = 0x3f800000;
            auVar43 = vsubps_avx(auVar56,auVar52);
            fVar41 = fVar41 + fVar41 * auVar43._0_4_;
            fVar45 = fVar45 + fVar45 * auVar43._4_4_;
            fVar46 = fVar46 + fVar46 * auVar43._8_4_;
            fVar47 = fVar47 + fVar47 * auVar43._12_4_;
            auVar72._0_4_ = fVar41 * local_10b8._0_4_;
            auVar72._4_4_ = fVar45 * local_10b8._4_4_;
            auVar72._8_4_ = fVar46 * local_10b8._8_4_;
            auVar72._12_4_ = fVar47 * local_10b8._12_4_;
            local_1058 = auVar72;
            local_1078[0] = fVar41 * local_10d8._0_4_;
            local_1078[1] = fVar45 * local_10d8._4_4_;
            local_1078[2] = fVar46 * local_10d8._8_4_;
            local_1078[3] = fVar47 * local_10d8._12_4_;
            auVar66._8_4_ = 0x7f800000;
            auVar66._0_8_ = 0x7f8000007f800000;
            auVar66._12_4_ = 0x7f800000;
            auVar43 = vblendvps_avx(auVar66,auVar72,local_10e8);
            local_1068[0] = fVar41 * local_10c8._0_4_;
            local_1068[1] = fVar45 * local_10c8._4_4_;
            local_1068[2] = fVar46 * local_10c8._8_4_;
            local_1068[3] = fVar47 * local_10c8._12_4_;
            auVar42 = vshufps_avx(auVar43,auVar43,0xb1);
            auVar42 = vminps_avx(auVar42,auVar43);
            auVar48 = vshufpd_avx(auVar42,auVar42,1);
            auVar42 = vminps_avx(auVar48,auVar42);
            auVar43 = vcmpps_avx(auVar43,auVar42,0);
            auVar48 = local_10e8 & auVar43;
            auVar42 = vpcmpeqd_avx(auVar42,auVar42);
            if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar48[0xf] < '\0') {
              auVar42 = auVar43;
            }
            lVar40 = lVar40 + uVar37;
            auVar43 = vandps_avx(local_10e8,auVar42);
            uVar38 = vmovmskps_avx(auVar43);
            uVar30 = CONCAT44((int)((ulong)context >> 0x20),uVar38);
            local_1178 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> local_1178 & 1) == 0; local_1178 = local_1178 + 1) {
              }
            }
            pRVar6 = (context->scene->geometries).items;
            uVar27 = *(uint *)(ray + k * 4 + 0x90);
            uStack_1170 = auVar49._8_8_;
            uVar30 = (ulong)*(uint *)(lVar40 + 0x90 + local_1178 * 4);
            pGVar39 = pRVar6[uVar30].ptr;
            while ((pGVar39->mask & uVar27) == 0) {
              *(undefined4 *)(local_10e8 + local_1178 * 4) = 0;
              if ((((local_10e8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_10e8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_10e8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_10e8[0xf]) goto LAB_00340bb9;
              auVar43 = vblendvps_avx(auVar66,auVar72,local_10e8);
              auVar42 = vshufps_avx(auVar43,auVar43,0xb1);
              auVar42 = vminps_avx(auVar42,auVar43);
              auVar48 = vshufpd_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar48,auVar42);
              auVar42 = vcmpps_avx(auVar43,auVar42,0);
              auVar48 = local_10e8 & auVar42;
              auVar43 = local_10e8;
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                auVar43 = vandps_avx(auVar42,local_10e8);
              }
              uVar38 = vmovmskps_avx(auVar43);
              uVar30 = CONCAT44(local_1178._4_4_,uVar38);
              lVar7 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              local_1178 = lVar7;
              uVar30 = (ulong)*(uint *)(lVar40 + 0x90 + lVar7 * 4);
              pGVar39 = pRVar6[uVar30].ptr;
            }
            fVar41 = local_1078[local_1178];
            fVar45 = local_1068[local_1178];
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1058 + local_1178 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1048 + local_1178 * 4);
            *(float *)(ray + k * 4 + 0xd0) = local_1038[local_1178];
            *(undefined4 *)(ray + k * 4 + 0xe0) =
                 *(undefined4 *)((long)&local_1028 + local_1178 * 4);
            *(float *)(ray + k * 4 + 0xf0) = fVar41;
            *(float *)(ray + k * 4 + 0x100) = fVar45;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar40 + 0xa0 + local_1178 * 4);
            *(int *)(ray + k * 4 + 0x120) = (int)uVar30;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
        }
LAB_00340bb9:
        lVar31 = lVar31 + 1;
      } while (lVar31 != uVar36 - 8);
    }
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar95 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
    auVar70 = ZEXT1664(local_fb8);
    auVar73 = ZEXT1664(local_fc8);
    auVar75 = ZEXT1664(local_fd8);
    auVar96 = ZEXT1664(local_1018);
    fVar41 = local_fe8;
    fVar45 = fStack_fe4;
    fVar46 = fStack_fe0;
    fVar47 = fStack_fdc;
    fVar97 = local_ff8;
    fVar80 = fStack_ff4;
    fVar82 = fStack_ff0;
    fVar84 = fStack_fec;
    fVar86 = local_1008;
    fVar89 = fStack_1004;
    fVar91 = fStack_1000;
    fVar93 = fStack_ffc;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }